

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O3

char * __thiscall
cmCompiledGeneratorExpression::Evaluate
          (cmCompiledGeneratorExpression *this,cmLocalGenerator *lg,string *config,bool quiet,
          cmGeneratorTarget *headTarget,cmGeneratorExpressionDAGChecker *dagChecker,string *language
          )

{
  char *pcVar1;
  
  pcVar1 = Evaluate(this,lg,config,quiet,headTarget,headTarget,dagChecker,language);
  return pcVar1;
}

Assistant:

const char *cmCompiledGeneratorExpression::Evaluate(cmLocalGenerator* lg,
  const std::string& config, bool quiet,
  const cmGeneratorTarget* headTarget,
  cmGeneratorExpressionDAGChecker *dagChecker,
                       std::string const& language) const
{
  return this->Evaluate(lg,
                        config,
                        quiet,
                        headTarget,
                        headTarget,
                        dagChecker,
                        language);
}